

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O3

string * __thiscall
chaiscript::Boxed_Number::to_string_abi_cxx11_(string *__return_storage_ptr__,Boxed_Number *this)

{
  bool bVar1;
  unsigned_short uVar2;
  short sVar3;
  Common_Types CVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 *puVar8;
  uint uVar9;
  unsigned_long uVar10;
  ulong uVar11;
  string *__str;
  uint uVar12;
  uint uVar13;
  pointer pcVar14;
  
  CVar4 = get_common_type(&this->bv);
  switch(CVar4) {
  case t_int32:
    uVar5 = get_as<int>(this);
    uVar12 = -uVar5;
    if (0 < (int)uVar5) {
      uVar12 = uVar5;
    }
    uVar13 = 1;
    if (9 < uVar12) {
      uVar13 = 4;
      uVar6 = (ulong)uVar12;
      do {
        uVar9 = (uint)uVar6;
        if (uVar9 < 100) goto LAB_002c72fd;
        if (uVar9 < 1000) goto LAB_002c7308;
        if (uVar9 < 10000) goto LAB_002c730b;
        uVar6 = uVar6 / 10000;
        uVar13 = uVar13 + 4;
      } while (99999 < uVar9);
LAB_002c7126:
      uVar13 = uVar13 - 3;
    }
    goto LAB_002c730b;
  case t_double:
    to_string_aux<double>(__return_storage_ptr__,&this->bv);
    break;
  case t_uint8:
    uVar12 = get_as<unsigned_int>(this);
    uVar5 = 1;
    if (9 < uVar12) {
      uVar5 = 4;
      uVar13 = uVar12;
      do {
        if (uVar13 < 100) goto LAB_002c7303;
        if (uVar13 < 1000) goto LAB_002c7332;
        if (uVar13 < 10000) goto LAB_002c7334;
        uVar5 = uVar5 + 4;
        bVar1 = 99999 < uVar13;
        uVar13 = uVar13 / 10000;
      } while (bVar1);
LAB_002c7266:
      uVar5 = uVar5 - 3;
    }
    goto LAB_002c7334;
  case t_int8:
    uVar5 = get_as<int>(this);
    uVar12 = -uVar5;
    if (0 < (int)uVar5) {
      uVar12 = uVar5;
    }
    uVar13 = 1;
    if (9 < uVar12) {
      uVar13 = 4;
      uVar6 = (ulong)uVar12;
      do {
        uVar9 = (uint)uVar6;
        if (uVar9 < 100) goto LAB_002c72fd;
        if (uVar9 < 1000) goto LAB_002c7308;
        if (uVar9 < 10000) goto LAB_002c730b;
        uVar6 = uVar6 / 10000;
        uVar13 = uVar13 + 4;
      } while (99999 < uVar9);
      goto LAB_002c7126;
    }
    goto LAB_002c730b;
  case t_uint16:
    uVar2 = get_as<unsigned_short>(this);
    uVar12 = (uint)uVar2;
    uVar13 = 1;
    if (((9 < uVar2) && (uVar13 = 2, 99 < uVar2)) && (uVar13 = 3, 999 < uVar2)) {
      uVar13 = 5 - (uVar2 < 10000);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (__return_storage_ptr__,(ulong)uVar13,'-');
    pcVar14 = (__return_storage_ptr__->_M_dataplus)._M_p;
    goto LAB_002c734d;
  case t_int16:
    sVar3 = get_as<short>(this);
    uVar5 = (uint)sVar3;
    uVar12 = -uVar5;
    if (0 < (int)uVar5) {
      uVar12 = uVar5;
    }
    uVar13 = 1;
    if (((9 < uVar12) && (uVar13 = 2, 99 < uVar12)) && (uVar13 = 3, 999 < uVar12)) {
      uVar13 = 5 - (uVar12 < 10000);
    }
LAB_002c730b:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (__return_storage_ptr__,(ulong)(uVar13 + -((int)uVar5 >> 0x1f)),'-');
    pcVar14 = (__return_storage_ptr__->_M_dataplus)._M_p + (uint)-((int)uVar5 >> 0x1f);
LAB_002c734d:
    std::__detail::__to_chars_10_impl<unsigned_int>(pcVar14,uVar13,uVar12);
    break;
  case t_uint32:
    uVar12 = get_as<unsigned_int>(this);
    uVar5 = 1;
    if (9 < uVar12) {
      uVar5 = 4;
      uVar13 = uVar12;
      do {
        if (uVar13 < 100) goto LAB_002c7303;
        if (uVar13 < 1000) goto LAB_002c7332;
        if (uVar13 < 10000) goto LAB_002c7334;
        uVar5 = uVar5 + 4;
        bVar1 = 99999 < uVar13;
        uVar13 = uVar13 / 10000;
      } while (bVar1);
      goto LAB_002c7266;
    }
    goto LAB_002c7334;
  case t_uint64:
    uVar6 = get_as<unsigned_long>(this);
    uVar12 = 1;
    if (9 < uVar6) {
      uVar10 = uVar6;
      uVar5 = 4;
      do {
        uVar12 = uVar5;
        if (uVar10 < 100) {
          uVar12 = uVar12 - 2;
          goto LAB_002c7363;
        }
        if (uVar10 < 1000) {
          uVar12 = uVar12 - 1;
          goto LAB_002c7363;
        }
        if (uVar10 < 10000) goto LAB_002c7363;
        bVar1 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        uVar5 = uVar12 + 4;
      } while (bVar1);
      uVar12 = uVar12 + 1;
    }
LAB_002c7363:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (__return_storage_ptr__,(ulong)uVar12,'\0');
    pcVar14 = (__return_storage_ptr__->_M_dataplus)._M_p;
    uVar12 = (uint)__return_storage_ptr__->_M_string_length;
    goto LAB_002c73a6;
  case t_int64:
    uVar7 = get_as<long>(this);
    uVar6 = -uVar7;
    if (0 < (long)uVar7) {
      uVar6 = uVar7;
    }
    uVar12 = 1;
    if (9 < uVar6) {
      uVar11 = uVar6;
      uVar5 = 4;
      do {
        uVar12 = uVar5;
        if (uVar11 < 100) {
          uVar12 = uVar12 - 2;
          goto LAB_002c7381;
        }
        if (uVar11 < 1000) {
          uVar12 = uVar12 - 1;
          goto LAB_002c7381;
        }
        if (uVar11 < 10000) goto LAB_002c7381;
        bVar1 = 99999 < uVar11;
        uVar11 = uVar11 / 10000;
        uVar5 = uVar12 + 4;
      } while (bVar1);
      uVar12 = uVar12 + 1;
    }
LAB_002c7381:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (__return_storage_ptr__,(ulong)(uVar12 - (int)((long)uVar7 >> 0x3f)),'-');
    pcVar14 = (__return_storage_ptr__->_M_dataplus)._M_p + -((long)uVar7 >> 0x3f);
LAB_002c73a6:
    std::__detail::__to_chars_10_impl<unsigned_long>(pcVar14,uVar12,uVar6);
    break;
  case t_float:
    to_string_aux<float>(__return_storage_ptr__,&this->bv);
    break;
  case t_long_double:
    to_string_aux<long_double>(__return_storage_ptr__,&this->bv);
    break;
  default:
    puVar8 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar8 = &PTR__bad_cast_003ceb38;
    __cxa_throw(puVar8,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
  }
  return __return_storage_ptr__;
LAB_002c7303:
  uVar5 = uVar5 - 2;
  goto LAB_002c7334;
LAB_002c7332:
  uVar5 = uVar5 - 1;
LAB_002c7334:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (__return_storage_ptr__,(ulong)uVar5,'\0');
  pcVar14 = (__return_storage_ptr__->_M_dataplus)._M_p;
  uVar13 = (uint)__return_storage_ptr__->_M_string_length;
  goto LAB_002c734d;
LAB_002c72fd:
  uVar13 = uVar13 - 2;
  goto LAB_002c730b;
LAB_002c7308:
  uVar13 = uVar13 - 1;
  goto LAB_002c730b;
}

Assistant:

std::string to_string() const {
      switch (get_common_type(bv)) {
        case Common_Types::t_int32:
          return std::to_string(get_as<int32_t>());
        case Common_Types::t_uint8:
          return std::to_string(get_as<uint32_t>());
        case Common_Types::t_int8:
          return std::to_string(get_as<int32_t>());
        case Common_Types::t_uint16:
          return std::to_string(get_as<uint16_t>());
        case Common_Types::t_int16:
          return std::to_string(get_as<int16_t>());
        case Common_Types::t_uint32:
          return std::to_string(get_as<uint32_t>());
        case Common_Types::t_uint64:
          return std::to_string(get_as<uint64_t>());
        case Common_Types::t_int64:
          return std::to_string(get_as<int64_t>());
        case Common_Types::t_double:
          return to_string_aux<double>(bv);
        case Common_Types::t_float:
          return to_string_aux<float>(bv);
        case Common_Types::t_long_double:
          return to_string_aux<long double>(bv);
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }